

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

ssl_ticket_aead_result_t __thiscall
bssl::decrypt_ticket_with_cipher_ctx
          (bssl *this,Array<unsigned_char> *out,EVP_CIPHER_CTX *cipher_ctx,HMAC_CTX *hmac_ctx,
          Span<const_unsigned_char> ticket)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  uchar *puVar6;
  size_t sVar7;
  uchar *in;
  Span<const_unsigned_char> SVar8;
  int local_104;
  int local_100;
  int len2;
  int len1;
  uchar *puStack_f0;
  undefined1 local_d8 [8];
  Array<unsigned_char> plaintext;
  Span<const_unsigned_char> ciphertext;
  Array<unsigned_char> *pAStack_b0;
  bool mac_ok;
  uchar *local_a8;
  undefined1 local_a0 [8];
  Span<const_unsigned_char> ticket_mac;
  size_t mac_len;
  uint8_t mac [64];
  size_t iv_len;
  HMAC_CTX *hmac_ctx_local;
  EVP_CIPHER_CTX *cipher_ctx_local;
  Array<unsigned_char> *out_local;
  Span<const_unsigned_char> ticket_local;
  
  ticket_local.data_ = ticket.data_;
  out_local = (Array<unsigned_char> *)hmac_ctx;
  uVar2 = EVP_CIPHER_CTX_iv_length((EVP_CIPHER_CTX *)out);
  ticket_mac.size_ = HMAC_size((HMAC_CTX *)cipher_ctx);
  sVar5 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&out_local);
  if (sVar5 < (ulong)uVar2 + 0x11 + ticket_mac.size_) {
    return ssl_ticket_aead_ignore_ticket;
  }
  _local_a0 = Span<const_unsigned_char>::last
                        ((Span<const_unsigned_char> *)&out_local,ticket_mac.size_);
  sVar5 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&out_local);
  SVar8 = Span<const_unsigned_char>::first
                    ((Span<const_unsigned_char> *)&out_local,sVar5 - ticket_mac.size_);
  pAStack_b0 = (Array<unsigned_char> *)SVar8.data_;
  out_local = pAStack_b0;
  local_a8 = (uchar *)SVar8.size_;
  ticket_local.data_ = local_a8;
  puVar6 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&out_local);
  sVar5 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&out_local);
  HMAC_Update((HMAC_CTX *)cipher_ctx,puVar6,sVar5);
  HMAC_Final((HMAC_CTX *)cipher_ctx,(uchar *)&mac_len,(uint *)0x0);
  sVar5 = ticket_mac.size_;
  sVar7 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_a0);
  if (sVar5 != sVar7) {
    __assert_fail("mac_len == ticket_mac.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x10a7,
                  "enum ssl_ticket_aead_result_t bssl::decrypt_ticket_with_cipher_ctx(Array<uint8_t> *, EVP_CIPHER_CTX *, HMAC_CTX *, Span<const uint8_t>)"
                 );
  }
  puVar6 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)local_a0);
  iVar3 = CRYPTO_memcmp(&mac_len,puVar6,ticket_mac.size_);
  iVar4 = CRYPTO_fuzzer_mode_enabled();
  if (iVar4 == 0 && iVar3 != 0) {
    return ssl_ticket_aead_ignore_ticket;
  }
  join_0x00000010_0x00000000_ =
       Span<const_unsigned_char>::subspan
                 ((Span<const_unsigned_char> *)&out_local,(ulong)uVar2 + 0x10,0xffffffffffffffff);
  Array<unsigned_char>::Array((Array<unsigned_char> *)local_d8);
  iVar3 = CRYPTO_fuzzer_mode_enabled();
  if (iVar3 == 0) {
    sVar5 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&plaintext.size_);
    if (0x7ffffffe < sVar5) {
      ticket_local.size_._4_4_ = ssl_ticket_aead_ignore_ticket;
      goto LAB_0016f96f;
    }
    sVar5 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&plaintext.size_);
    bVar1 = Array<unsigned_char>::InitForOverwrite((Array<unsigned_char> *)local_d8,sVar5);
    if (!bVar1) {
      ticket_local.size_._4_4_ = ssl_ticket_aead_error;
      goto LAB_0016f96f;
    }
    puVar6 = Array<unsigned_char>::data((Array<unsigned_char> *)local_d8);
    in = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&plaintext.size_);
    sVar5 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&plaintext.size_);
    iVar3 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)out,puVar6,&local_100,in,(int)sVar5);
    if (iVar3 != 0) {
      puVar6 = Array<unsigned_char>::data((Array<unsigned_char> *)local_d8);
      iVar3 = EVP_DecryptFinal_ex((EVP_CIPHER_CTX *)out,puVar6 + local_100,&local_104);
      if (iVar3 != 0) {
        Array<unsigned_char>::Shrink
                  ((Array<unsigned_char> *)local_d8,(long)local_100 + (long)local_104);
        goto LAB_0016f94c;
      }
    }
    ERR_clear_error();
    ticket_local.size_._4_4_ = ssl_ticket_aead_ignore_ticket;
  }
  else {
    _len1 = plaintext.size_;
    puStack_f0 = ciphertext.data_;
    bVar1 = Array<unsigned_char>::CopyFrom((Array<unsigned_char> *)local_d8,stack0xffffffffffffff38)
    ;
    if (!bVar1) {
      ticket_local.size_._4_4_ = ssl_ticket_aead_error;
      goto LAB_0016f96f;
    }
LAB_0016f94c:
    Array<unsigned_char>::operator=((Array<unsigned_char> *)this,(Array<unsigned_char> *)local_d8);
    ticket_local.size_._4_4_ = ssl_ticket_aead_success;
  }
LAB_0016f96f:
  len2 = 1;
  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_d8);
  return ticket_local.size_._4_4_;
}

Assistant:

static enum ssl_ticket_aead_result_t decrypt_ticket_with_cipher_ctx(
    Array<uint8_t> *out, EVP_CIPHER_CTX *cipher_ctx, HMAC_CTX *hmac_ctx,
    Span<const uint8_t> ticket) {
  size_t iv_len = EVP_CIPHER_CTX_iv_length(cipher_ctx);

  // Check the MAC at the end of the ticket.
  uint8_t mac[EVP_MAX_MD_SIZE];
  size_t mac_len = HMAC_size(hmac_ctx);
  if (ticket.size() < SSL_TICKET_KEY_NAME_LEN + iv_len + 1 + mac_len) {
    // The ticket must be large enough for key name, IV, data, and MAC.
    return ssl_ticket_aead_ignore_ticket;
  }
  // Split the ticket into the ticket and the MAC.
  auto ticket_mac = ticket.last(mac_len);
  ticket = ticket.first(ticket.size() - mac_len);
  HMAC_Update(hmac_ctx, ticket.data(), ticket.size());
  HMAC_Final(hmac_ctx, mac, NULL);
  assert(mac_len == ticket_mac.size());
  bool mac_ok = CRYPTO_memcmp(mac, ticket_mac.data(), mac_len) == 0;
  if (CRYPTO_fuzzer_mode_enabled()) {
    mac_ok = true;
  }
  if (!mac_ok) {
    return ssl_ticket_aead_ignore_ticket;
  }

  // Decrypt the session data.
  auto ciphertext = ticket.subspan(SSL_TICKET_KEY_NAME_LEN + iv_len);
  Array<uint8_t> plaintext;
  if (CRYPTO_fuzzer_mode_enabled()) {
    if (!plaintext.CopyFrom(ciphertext)) {
      return ssl_ticket_aead_error;
    }
  } else {
    if (ciphertext.size() >= INT_MAX) {
      return ssl_ticket_aead_ignore_ticket;
    }
    if (!plaintext.InitForOverwrite(ciphertext.size())) {
      return ssl_ticket_aead_error;
    }
    int len1, len2;
    if (!EVP_DecryptUpdate(cipher_ctx, plaintext.data(), &len1,
                           ciphertext.data(), (int)ciphertext.size()) ||
        !EVP_DecryptFinal_ex(cipher_ctx, plaintext.data() + len1, &len2)) {
      ERR_clear_error();
      return ssl_ticket_aead_ignore_ticket;
    }
    plaintext.Shrink(static_cast<size_t>(len1) + len2);
  }

  *out = std::move(plaintext);
  return ssl_ticket_aead_success;
}